

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void destroyBindings(BINDING *bindings,XML_Parser parser)

{
  XML_Parser pvVar1;
  BINDING *b;
  XML_Parser parser_local;
  BINDING *bindings_local;
  
  parser_local = bindings;
  while (parser_local != (XML_Parser)0x0) {
    pvVar1 = *(XML_Parser *)((long)parser_local + 8);
    (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser_local + 0x20));
    (**(code **)((long)parser + 0x28))(parser_local);
    parser_local = pvVar1;
  }
  return;
}

Assistant:

static
void destroyBindings(BINDING *bindings, XML_Parser parser)
{
  for (;;) {
    BINDING *b = bindings;
    if (!b)
      break;
    bindings = b->nextTagBinding;
    FREE(b->uri);
    FREE(b);
  }
}